

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rejectLeave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int leaveNum,SPxId leaveId,Status leaveStat,
             SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4)

{
  long lVar1;
  long lVar2;
  Status **ppSVar3;
  long lVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  lVar7 = (long)leaveNum;
  if (leaveId.super_DataKey.info < 0) {
    ppSVar3 = &(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.rowstat.data;
    if (leaveStat != D_ON_BOTH) goto LAB_004f07fd;
    bVar10 = (*ppSVar3)[lVar7] == P_ON_LOWER;
    lVar1 = 0xf50;
    lVar8 = 0xf68;
    lVar4 = 0xf68;
  }
  else {
    ppSVar3 = &(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat.data;
    if (leaveStat != D_ON_BOTH) goto LAB_004f07fd;
    bVar10 = (*ppSVar3)[lVar7] == P_ON_UPPER;
    lVar1 = 0xf80;
    lVar8 = 0xf98;
    lVar4 = 0xf98;
  }
  lVar2 = lVar1;
  if (bVar10) {
    lVar2 = lVar8;
    lVar4 = lVar1;
  }
  lVar4 = *(long *)((long)&(this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._vptr_ClassArray + lVar4);
  lVar9 = lVar7 * 0x80;
  lVar1 = *(long *)((long)&(this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._vptr_ClassArray + lVar2);
  puVar5 = (undefined4 *)(lVar4 + lVar9);
  puVar6 = (undefined4 *)(lVar1 + lVar9);
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + 1;
    puVar6 = puVar6 + 1;
  }
  *(undefined4 *)(lVar1 + 0x70 + lVar9) = *(undefined4 *)(lVar4 + 0x70 + lVar9);
  *(undefined1 *)(lVar1 + 0x74 + lVar9) = *(undefined1 *)(lVar4 + 0x74 + lVar9);
  *(undefined8 *)(lVar1 + 0x78 + lVar9) = *(undefined8 *)(lVar4 + 0x78 + lVar9);
LAB_004f07fd:
  (*ppSVar3)[lVar7] = leaveStat;
  return;
}

Assistant:

void SPxSolverBase<R>::rejectLeave(
   int leaveNum,
   SPxId leaveId,
   typename SPxBasisBase<R>::Desc::Status leaveStat,
   const SVectorBase<R>* //newVec
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(leaveId.isSPxRowId())
   {
      SPxOut::debug(this, "DLEAVE58 rejectLeave()  : row {}: {} -> {}\n", leaveNum,
                    ds.rowStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.rowStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_LOWER)
            theLRbound[leaveNum] = theURbound[leaveNum];
         else
            theURbound[leaveNum] = theLRbound[leaveNum];
      }

      ds.rowStatus(leaveNum) = leaveStat;
   }
   else
   {
      SPxOut::debug(this, "DLEAVE59 rejectLeave()  : col {}: {} -> {}\n", leaveNum,
                    ds.colStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.colStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_UPPER)
            theLCbound[leaveNum] = theUCbound[leaveNum];
         else
            theUCbound[leaveNum] = theLCbound[leaveNum];
      }

      ds.colStatus(leaveNum) = leaveStat;
   }
}